

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O3

int __thiscall ReadData::ResetObs(ReadData *this)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    *(undefined8 *)(&this->field_0x18 + lVar1) = 0xbff0000000000000;
    *(undefined4 *)(&this->field_0x0 + lVar1) = 0;
    *(undefined8 *)(&this->field_0x8 + lVar1) = 0xbff0000000000000;
    *(undefined8 *)((long)(&this->field_0x8 + lVar1) + 8) = 0xbff0000000000000;
    lVar1 = lVar1 + 0x70;
  } while (lVar1 != 0x1c00);
  lVar1 = 0;
  do {
    *(undefined8 *)(&this->field_0x1c18 + lVar1) = 0xbff0000000000000;
    *(undefined4 *)(&this->field_0x1c00 + lVar1) = 0;
    *(undefined8 *)(&this->field_0x1c08 + lVar1) = 0xbff0000000000000;
    *(undefined8 *)((long)(&this->field_0x1c08 + lVar1) + 8) = 0xbff0000000000000;
    lVar1 = lVar1 + 0x70;
  } while (lVar1 != 0xe00);
  return 0;
}

Assistant:

int ReadData::ResetObs() {
    for(int i = 0; i < MAXBDSSRN; ++i) {
        this->BDSObs[i].psr[0] = -1;
        this->BDSObs[i].psr[1] = -1;
        this->BDSObs[i].ObsTime.Week = 0;
        this->BDSObs[i].ObsTime.SOW = -1;
    }
    for(int i = 0; i < MAXGPSSRN; ++i) {
        this->GPSObs[i].psr[0] = -1;
        this->GPSObs[i].psr[1] = -1;
        this->GPSObs[i].ObsTime.Week = 0;
        this->GPSObs[i].ObsTime.SOW = -1;
    }
    return 0;
}